

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O1

bool __thiscall
QAbstractSliderPrivate::scrollByDelta
          (QAbstractSliderPrivate *this,Orientation orientation,KeyboardModifiers modifiers,
          int delta)

{
  float fVar1;
  QAbstractSlider *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  float fVar6;
  
  iVar2 = -delta;
  if (orientation != Horizontal) {
    iVar2 = delta;
  }
  this_00 = *(QAbstractSlider **)&(this->super_QWidgetPrivate).field_0x8;
  fVar6 = (float)iVar2 / 120.0;
  if (((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i & 0x6000000) == 0) {
    iVar2 = QApplication::wheelScrollLines();
    fVar1 = this->offset_accumulated;
    if (((fVar1 != 0.0) || (NAN(fVar1))) && (fVar6 / fVar1 < 0.0)) {
      this->offset_accumulated = 0.0;
    }
    fVar6 = (float)this->singleStep * (float)iVar2 * fVar6 + this->offset_accumulated;
    iVar2 = this->pageStep;
    iVar4 = -iVar2;
    iVar3 = (int)fVar6;
    if (iVar2 < (int)fVar6) {
      iVar3 = iVar2;
    }
    if (iVar3 == iVar4 || SBORROW4(iVar3,iVar4) != iVar3 + iVar2 < 0) {
      iVar3 = iVar4;
    }
    fVar6 = fVar6 - (float)(int)fVar6;
    this->offset_accumulated = fVar6;
    if (iVar3 == 0) {
      if ((this->field_0x27c & 0x10) != 0) {
        fVar6 = -fVar6;
      }
      if (0.0 < fVar6) {
        iVar2 = 1;
        if (this->value < this->maximum) goto LAB_003c9577;
      }
      if (fVar6 < 0.0) {
        iVar2 = 1;
        if (*(int *)&(this->super_QWidgetPrivate).field_0x254 < this->value) goto LAB_003c9577;
      }
      this->offset_accumulated = 0.0;
      iVar2 = 0;
    }
LAB_003c9577:
    bVar5 = (byte)iVar2;
    if (iVar3 == 0) goto LAB_003c95c7;
  }
  else {
    iVar2 = this->pageStep;
    iVar4 = -iVar2;
    iVar3 = (int)(fVar6 * (float)iVar2);
    if (iVar2 < (int)(fVar6 * (float)iVar2)) {
      iVar3 = iVar2;
    }
    if (iVar3 == iVar4 || SBORROW4(iVar3,iVar4) != iVar3 + iVar2 < 0) {
      iVar3 = iVar4;
    }
    this->offset_accumulated = 0.0;
  }
  iVar2 = -iVar3;
  if ((this->field_0x27c & 0x10) == 0) {
    iVar2 = iVar3;
  }
  iVar3 = this->value;
  iVar2 = (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xa8))(this,iVar2 + iVar3);
  this->position = iVar2;
  QAbstractSlider::triggerAction(this_00,SliderMove);
  bVar5 = iVar3 != this->value;
  if (!(bool)bVar5) {
    this->offset_accumulated = 0.0;
    bVar5 = 0;
  }
LAB_003c95c7:
  return (bool)(bVar5 & 1);
}

Assistant:

bool QAbstractSliderPrivate::scrollByDelta(Qt::Orientation orientation, Qt::KeyboardModifiers modifiers, int delta)
{
    Q_Q(QAbstractSlider);
    int stepsToScroll = 0;
    // in Qt scrolling to the right gives negative values.
    if (orientation == Qt::Horizontal)
        delta = -delta;
    qreal offset = qreal(delta) / 120;

    if ((modifiers & Qt::ControlModifier) || (modifiers & Qt::ShiftModifier)) {
        // Scroll one page regardless of delta:
        stepsToScroll = qBound(-pageStep, int(offset * pageStep), pageStep);
        offset_accumulated = 0;
    } else {
        // Calculate how many lines to scroll. Depending on what delta is (and
        // offset), we might end up with a fraction (e.g. scroll 1.3 lines). We can
        // only scroll whole lines, so we keep the reminder until next event.
        qreal stepsToScrollF =
#if QT_CONFIG(wheelevent)
                QApplication::wheelScrollLines() *
#endif
                offset * effectiveSingleStep();
        // Check if wheel changed direction since last event:
        if (offset_accumulated != 0 && (offset / offset_accumulated) < 0)
            offset_accumulated = 0;

        offset_accumulated += stepsToScrollF;

        // Don't scroll more than one page in any case:
        stepsToScroll = qBound(-pageStep, int(offset_accumulated), pageStep);

        offset_accumulated -= int(offset_accumulated);
        if (stepsToScroll == 0) {
            // We moved less than a line, but might still have accumulated partial scroll,
            // unless we already are at one of the ends.
            const float effective_offset = invertedControls ? -offset_accumulated : offset_accumulated;
            if (effective_offset > 0.f && value < maximum)
                return true;
            if (effective_offset < 0.f && value > minimum)
                return true;
            offset_accumulated = 0;
            return false;
        }
    }

    if (invertedControls)
        stepsToScroll = -stepsToScroll;

    int prevValue = value;
    position = bound(overflowSafeAdd(stepsToScroll)); // value will be updated by triggerAction()
    q->triggerAction(QAbstractSlider::SliderMove);

    if (prevValue == value) {
        offset_accumulated = 0;
        return false;
    }
    return true;
}